

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeDisc.cpp
# Opt level: O0

void pzshape::TPZShapeDisc::Shape
               (int *dimension,int *degree,TPZVec<double> *X,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi,MShapeType type)

{
  int in_R9D;
  TPZManVector<double,_3> X0;
  REAL C;
  size_t in_stack_00000388;
  char *in_stack_00000390;
  MShapeType in_stack_00005744;
  TPZFMatrix<double> *in_stack_00005748;
  TPZFMatrix<double> *in_stack_00005750;
  int in_stack_0000575c;
  TPZVec<double> *in_stack_00005760;
  TPZVec<double> *in_stack_00005768;
  REAL in_stack_00005770;
  TPZManVector<double,_3> *in_stack_ffffffffffffff70;
  double *in_stack_ffffffffffffff90;
  int64_t in_stack_ffffffffffffff98;
  TPZManVector<double,_3> *in_stack_ffffffffffffffa0;
  
  TPZManVector<double,_3>::TPZManVector
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  if ((in_R9D == 0) || (in_R9D == 1)) {
    Shape2D(in_stack_00005770,in_stack_00005768,in_stack_00005760,in_stack_0000575c,
            in_stack_00005750,in_stack_00005748,in_stack_00005744);
  }
  else {
    in_stack_ffffffffffffff70 =
         (TPZManVector<double,_3> *)std::operator<<((ostream *)&std::cout,"Not implement");
    std::ostream::operator<<(in_stack_ffffffffffffff70,std::endl<char,std::char_traits<char>>);
    pzinternal::DebugStopImpl(in_stack_00000390,in_stack_00000388);
  }
  TPZManVector<double,_3>::~TPZManVector(in_stack_ffffffffffffff70);
  return;
}

Assistant:

void TPZShapeDisc::Shape(int &dimension,int &degree,TPZVec<REAL> &X, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi,MShapeType type)
		{
				REAL C=1;//fator de escala utilizado neste metodo
				TPZManVector<REAL,3> X0(3,0.);//centro do elemento
				
				if(type == ETensorial ||type == EOrdemTotal){
						TPZShapeDisc::Shape2D(C,X0,X,degree,phi,dphi,type);
				}
				else {
						std::cout<<"Not implement"<<std::endl;
						DebugStop();
				}
				
				
				
		}